

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
          (QMultiHash<QString,_QCss::StyleRule> *this,QString *key,StyleRule *args)

{
  long lVar1;
  bool bVar2;
  QMultiHash<QString,_QCss::StyleRule> *in_RCX;
  StyleRule *in_RDX;
  QString *in_RSI;
  StyleRule *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<QString,_QCss::StyleRule> copy;
  QMultiHash<QString,_QCss::StyleRule> *in_stack_ffffffffffffff78;
  StyleRule *args_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = in_RDI;
  bVar2 = QMultiHash<QString,_QCss::StyleRule>::isDetached
                    ((QMultiHash<QString,_QCss::StyleRule> *)in_RDI);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::shouldGrow
                      ((Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)(in_RSI->d).d);
    if (bVar2) {
      QCss::StyleRule::StyleRule(in_RDI,in_RDX);
      QMultiHash<QString,_QCss::StyleRule>::emplace_helper<QCss::StyleRule>(in_RCX,in_RSI,args_00);
      QCss::StyleRule::~StyleRule(in_RDI);
    }
    else {
      emplace_helper<QCss::StyleRule_const&>(in_RCX,in_RSI,args_00);
    }
  }
  else {
    QMultiHash<QString,_QCss::StyleRule>::QMultiHash
              ((QMultiHash<QString,_QCss::StyleRule> *)in_RDI,in_stack_ffffffffffffff78);
    QMultiHash<QString,_QCss::StyleRule>::detach((QMultiHash<QString,_QCss::StyleRule> *)in_RDI);
    emplace_helper<QCss::StyleRule_const&>(in_RCX,in_RSI,args_00);
    QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
              ((QMultiHash<QString,_QCss::StyleRule> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator *)args_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }